

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall
cpp_properties::
cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
::cpp_properties_lexer
          (cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           *this)

{
  lexer_def *this_00;
  pattern_adder *ppVar1;
  adder *paVar2;
  string_type local_588;
  string_type local_568;
  string_type local_548;
  string_type local_528;
  string_type local_508;
  string_type local_4e8;
  string_type local_4c8;
  string_type local_4a8;
  string_type local_488;
  string_type local_468;
  string_type local_448;
  string_type local_428;
  string_type local_408;
  string_type local_3e8;
  string_type local_3c8;
  string_type local_3a8;
  string_type local_388;
  string_type local_368;
  string_type local_348;
  string_type local_328;
  string_type local_308;
  string_type local_2e8;
  string_type local_2c8;
  string_type local_2a8;
  string_type local_288;
  string_type local_268;
  string_type local_248;
  string_type local_228;
  string_type local_208;
  string_type local_1e8;
  string_type local_1c8;
  string_type local_1a8;
  string_type local_188;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_168;
  string_type local_108;
  string_type local_e8;
  allocator<char> local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator<char> local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  allocator<char> local_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  allocator<char> local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string_type local_a0;
  string_type local_80;
  string_type local_60;
  string_type local_40;
  
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  ::lexer(&this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
          ,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"cr",&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\\r",&local_c7);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()
                     (&(this->
                       super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                       ).self.add_pattern,(string_type *)&local_168,&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"lf",&local_c6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"\\n",&local_c5);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_60,&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"eol",&local_c4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"\\r\\n",&local_c3);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_a0,&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"lb_cr",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\\\\\\r[ \\f\\t]*",&local_c1);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_e8,&local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"lb_lf",&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"\\\\\\n[ \\f\\t]*",&local_bf);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_1a8,&local_268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"lb_eol",&local_be);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"\\\\\\r\\n[ \\f\\t]*",&local_bd);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_248,&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"spaces",&local_bc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"[ \\f\\t]+",&local_bb);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_208,&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"sharp",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"#",&local_b9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_1c8,&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"exclamation",&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"!",&local_b7);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_288,&local_588);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"comment",&local_b6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"[^ \\f\\t\\r\\n]+",&local_b5);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_568,&local_548);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"colon",&local_b4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,":",&local_b3);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_528,&local_508);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"equal",&local_b2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"=",&local_b1);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_4e8,&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"backslash",&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"\\\\",&local_af);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_4a8,&local_488);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"first_key",&local_ae);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*",&local_ad);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_468,&local_448);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"key",&local_ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"[^ \\f\\t\\r\\n\\\\=:]+",&local_ab);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_428,&local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"blank_value",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*",&local_a9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_3e8,&local_3c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"value",&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"[^ \\f\\t\\r\\n\\\\]+",&local_a7);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_3a8,&local_388);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"unicode",&local_a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"\\\\u[0-9a-fA-F]{4}",&local_a5);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_368,&local_348);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"bad_unicode",&local_a4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"\\\\u[0-9a-fA-F]{0,3}",&local_a3);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_328,&local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"escape",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"\\\\[^\\r\\n]",&local_a1)
  ;
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::pattern_adder::operator()(ppVar1,&local_2e8,&local_2c8);
  this_00 = &(this->
             super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
             ).self;
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{spaces}",(allocator<char> *)&local_1a8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{cr}",(allocator<char> *)&local_268);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x3e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{lf}",(allocator<char> *)&local_248);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x3ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{eol}",(allocator<char> *)&local_228);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_a0,0x3eb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"{lb_cr}",(allocator<char> *)&local_208);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_108,0x3ec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"{lb_lf}",(allocator<char> *)&local_1e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_e8,0x3ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"{lb_eol}",(allocator<char> *)&local_1c8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_188,0x3ee);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"INITIAL","COMMENT");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{sharp}",(allocator<char> *)&local_80);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3ef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{exclamation}",(allocator<char> *)&local_a0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_60,0x3f0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"COMMENT");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{comment}",(allocator<char> *)&local_80);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{spaces}",(allocator<char> *)&local_a0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_60,0x3f2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"COMMENT","INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{cr}",(allocator<char> *)&local_a0);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lf}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x3f4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{eol}",(allocator<char> *)&local_e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_80,0x3f5);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"INITIAL","KEY");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{first_key}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3f6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{escape}",(allocator<char> *)&local_e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x3f7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{unicode}",(allocator<char> *)&local_188);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{bad_unicode}",(allocator<char> *)&local_1a8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_a0,0x3f9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"KEY");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{key}",(allocator<char> *)&local_1a8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3f6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{escape}",(allocator<char> *)&local_268);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x3f7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{unicode}",(allocator<char> *)&local_248);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{lb_cr}",(allocator<char> *)&local_228);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_a0,0x3fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"{lb_lf}",(allocator<char> *)&local_208);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_108,0x3fe);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"{lb_eol}",(allocator<char> *)&local_1e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_e8,0x3ff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"{bad_unicode}",(allocator<char> *)&local_1c8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_188,0x3f9);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"KEY","INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{cr}",(allocator<char> *)&local_a0);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x3fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lf}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x3fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{eol}",(allocator<char> *)&local_e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_80,0x3fc);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"KEY","SEPARATOR");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{colon}",(allocator<char> *)&local_80);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{equal}",(allocator<char> *)&local_a0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_60,0x401);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"KEY","BLANK_SEPARATOR");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{spaces}",(allocator<char> *)&local_60);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(&local_168.add,&local_40,0x402);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"BLANK_SEPARATOR");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{lb_cr}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x406);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lb_lf}",(allocator<char> *)&local_e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x407);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{lb_eol}",(allocator<char> *)&local_188);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{spaces}",(allocator<char> *)&local_1a8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_a0,0x402);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"BLANK_SEPARATOR","INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{cr}",(allocator<char> *)&local_a0);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x403);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lf}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x404);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{eol}",(allocator<char> *)&local_e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_80,0x405);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"BLANK_SEPARATOR","SEPARATOR");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{colon}",(allocator<char> *)&local_80);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{equal}",(allocator<char> *)&local_a0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_60,0x401);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"INITIAL","SEPARATOR");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{colon}",(allocator<char> *)&local_80);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{equal}",(allocator<char> *)&local_a0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_60,0x401);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"SEPARATOR","INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{cr}",(allocator<char> *)&local_a0);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x403);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lf}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x404);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{eol}",(allocator<char> *)&local_e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_80,0x405);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"SEPARATOR","VALUE");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{spaces}",(allocator<char> *)&local_268);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x409);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{value}",(allocator<char> *)&local_248);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x40a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{escape}",(allocator<char> *)&local_228);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x40b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{unicode}",(allocator<char> *)&local_208);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_a0,0x40c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"{lb_cr}",(allocator<char> *)&local_1e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_108,0x411);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"{lb_lf}",(allocator<char> *)&local_1c8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_e8,0x412);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"{lb_eol}",(allocator<char> *)&local_2a8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_188,0x413);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"{bad_unicode}",(allocator<char> *)&local_288);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1a8,0x40d);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"BLANK_SEPARATOR","VALUE");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{blank_value}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x40a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{escape}",(allocator<char> *)&local_e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x40b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{unicode}",(allocator<char> *)&local_188);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x40c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{bad_unicode}",(allocator<char> *)&local_1a8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_a0,0x40d);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"VALUE");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{spaces}",(allocator<char> *)&local_268);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x409);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{value}",(allocator<char> *)&local_248);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x40a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{escape}",(allocator<char> *)&local_228);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_80,0x40b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"{unicode}",(allocator<char> *)&local_208);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_a0,0x40c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"{lb_cr}",(allocator<char> *)&local_1e8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_108,0x411);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"{lb_lf}",(allocator<char> *)&local_1c8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_e8,0x412);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"{lb_eol}",(allocator<char> *)&local_2a8);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_188,0x413);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"{bad_unicode}",(allocator<char> *)&local_288);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1a8,0x40d);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_168,this_00,"VALUE","INITIAL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"{cr}",(allocator<char> *)&local_a0);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_168.add,&local_40,0x40e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"{lf}",(allocator<char> *)&local_108);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_60,0x40f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"{eol}",(allocator<char> *)&local_e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_80,0x410);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_168);
  return;
}

Assistant:

cpp_properties_lexer()
    {
        using namespace token;
        this->self.add_pattern
            ("cr"          , "\\r")
            ("lf"          , "\\n")
            ("eol"         , "\\r\\n")

            ("lb_cr"       , "\\\\\\r[ \\f\\t]*")
            ("lb_lf"       , "\\\\\\n[ \\f\\t]*")
            ("lb_eol"      , "\\\\\\r\\n[ \\f\\t]*")

            ("spaces"      , "[ \\f\\t]+")

            ("sharp"       , "#")
            ("exclamation" , "!")
            ("comment"     , "[^ \\f\\t\\r\\n]+")

            ("colon"       , ":")
            ("equal"       , "=")

            ("backslash"   , "\\\\")
            ("first_key"   , "[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*")
            ("key"         , "[^ \\f\\t\\r\\n\\\\=:]+")

            ("blank_value" , "[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*")
            ("value"       , "[^ \\f\\t\\r\\n\\\\]+")

            ("unicode"     , "\\\\u[0-9a-fA-F]{4}")
            ("bad_unicode" , "\\\\u[0-9a-fA-F]{0,3}")
            ("escape"      , "\\\\[^\\r\\n]")
        ;

        this->self("INITIAL").add
            ("{spaces}"      , ID_SPACES)
            ("{cr}"          , ID_CR)
            ("{lf}"          , ID_LF)
            ("{eol}"         , ID_EOL)
            ("{lb_cr}"       , ID_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_LINE_BREAK_EOL)
        ;

        this->self("INITIAL", "COMMENT").add
            ("{sharp}"       , ID_COMMENT_SHARP)
            ("{exclamation}" , ID_COMMENT_EXCLAMATION)
        ;

        this->self("COMMENT").add
            ("{comment}"     , ID_COMMENT_CHARS)
            ("{spaces}"      , ID_COMMENT_SPACES)
        ;

        this->self("COMMENT", "INITIAL").add
            ("{cr}"          , ID_COMMENT_CR)
            ("{lf}"          , ID_COMMENT_LF)
            ("{eol}"         , ID_COMMENT_EOL)
        ;

        this->self("INITIAL", "KEY").add
            ("{first_key}"   , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY").add
            ("{key}"         , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{lb_cr}"       , ID_KEY_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_KEY_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_KEY_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY", "INITIAL").add
            ("{cr}"          , ID_KEY_CR)
            ("{lf}"          , ID_KEY_LF)
            ("{eol}"         , ID_KEY_EOL)
        ;

        this->self("KEY", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("KEY", "BLANK_SEPARATOR").add
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR").add
            ("{lb_cr}"       , ID_SEPARATOR_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_SEPARATOR_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_SEPARATOR_LINE_BREAK_EOL)
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("BLANK_SEPARATOR", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("INITIAL", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("SEPARATOR", "VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("BLANK_SEPARATOR", "VALUE").add
            ("{blank_value}" , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE", "INITIAL").add
            ("{cr}"          , ID_VALUE_CR)
            ("{lf}"          , ID_VALUE_LF)
            ("{eol}"         , ID_VALUE_EOL)
        ;

    }